

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RenameTableInfo::Deserialize(RenameTableInfo *this,Deserializer *deserializer)

{
  tuple<duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_> this_00;
  pointer pRVar1;
  __uniq_ptr_impl<duckdb::RenameTableInfo,_std::default_delete<duckdb::RenameTableInfo>_> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>.
  super__Head_base<0UL,_duckdb::RenameTableInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>)
       operator_new(0x98);
  RenameTableInfo((RenameTableInfo *)
                  this_00.
                  super__Tuple_impl<0UL,_duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>
                  .super__Head_base<0UL,_duckdb::RenameTableInfo_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>.
  super__Head_base<0UL,_duckdb::RenameTableInfo_*,_false>._M_head_impl =
       (tuple<duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>)
       (tuple<duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>
       .super__Head_base<0UL,_duckdb::RenameTableInfo_*,_false>._M_head_impl;
  pRVar1 = unique_ptr<duckdb::RenameTableInfo,_std::default_delete<duckdb::RenameTableInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameTableInfo,_std::default_delete<duckdb::RenameTableInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"new_table_name",&pRVar1->new_table_name);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::RenameTableInfo_*,_std::default_delete<duckdb::RenameTableInfo>_>
       .super__Head_base<0UL,_duckdb::RenameTableInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RenameTableInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameTableInfo>(new RenameTableInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "new_table_name", result->new_table_name);
	return std::move(result);
}